

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_glfw.cpp
# Opt level: O3

void ImGui_ImplGlfw_ScrollCallback(GLFWwindow *window,double xoffset,double yoffset)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImGuiIO *pIVar3;
  
  if (g_PrevUserCallbackScroll != (GLFWscrollfun)0x0) {
    (*g_PrevUserCallbackScroll)(window,xoffset,yoffset);
  }
  pIVar3 = ImGui::GetIO();
  uVar1 = pIVar3->MouseWheel;
  uVar2 = pIVar3->MouseWheelH;
  pIVar3->MouseWheel = (float)uVar1 + (float)yoffset;
  pIVar3->MouseWheelH = (float)uVar2 + (float)xoffset;
  return;
}

Assistant:

void ImGui_ImplGlfw_ScrollCallback(GLFWwindow* window, double xoffset, double yoffset)
{
    if (g_PrevUserCallbackScroll != NULL)
        g_PrevUserCallbackScroll(window, xoffset, yoffset);

    ImGuiIO& io = ImGui::GetIO();
    io.MouseWheelH += (float)xoffset;
    io.MouseWheel += (float)yoffset;
}